

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

void __thiscall
cppwinrt::method_signature::method_signature(method_signature *this,MethodDef *method)

{
  uint32_t uVar1;
  undefined4 uVar2;
  bool bVar3;
  unsigned_short uVar4;
  RetTypeSig *this_00;
  ulong uVar5;
  size_t sVar6;
  value_type vVar7;
  pair<__gnu_cxx::__normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>,___gnu_cxx::__normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>_>
  local_90;
  reference local_80;
  table_base *local_78;
  uint32_t local_70;
  Param local_68;
  pair<__gnu_cxx::__normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>,___gnu_cxx::__normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>_>
  local_58;
  uint local_48;
  uint32_t i;
  undefined1 local_38 [8];
  pair<winmd::reader::Param,_winmd::reader::Param> params;
  MethodDef *method_local;
  method_signature *this_local;
  
  uVar1 = (method->super_row_base<winmd::reader::MethodDef>).m_index;
  uVar2 = *(undefined4 *)&(method->super_row_base<winmd::reader::MethodDef>).field_0xc;
  (this->m_method).super_row_base<winmd::reader::MethodDef>.m_table =
       (method->super_row_base<winmd::reader::MethodDef>).m_table;
  (this->m_method).super_row_base<winmd::reader::MethodDef>.m_index = uVar1;
  *(undefined4 *)&(this->m_method).super_row_base<winmd::reader::MethodDef>.field_0xc = uVar2;
  params.second.super_row_base<winmd::reader::Param>._8_8_ = method;
  winmd::reader::MethodDef::Signature(&this->m_signature,method);
  std::
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  ::vector(&this->m_params);
  winmd::reader::Param::Param(&this->m_return);
  winmd::reader::MethodDef::ParamList
            ((pair<winmd::reader::Param,_winmd::reader::Param> *)local_38,
             (MethodDef *)params.second.super_row_base<winmd::reader::Param>._8_8_);
  this_00 = winmd::reader::MethodDefSig::ReturnType(&this->m_signature);
  bVar3 = winmd::reader::RetTypeSig::operator_cast_to_bool(this_00);
  if (((bVar3) &&
      (bVar3 = winmd::reader::row_base<winmd::reader::Param>::operator!=
                         ((row_base<winmd::reader::Param> *)local_38,
                          (row_base<winmd::reader::Param> *)
                          &params.first.super_row_base<winmd::reader::Param>.m_index), bVar3)) &&
     (uVar4 = winmd::reader::Param::Sequence((Param *)local_38), uVar4 == 0)) {
    (this->m_return).super_row_base<winmd::reader::Param>.m_table = (table_base *)local_38;
    (this->m_return).super_row_base<winmd::reader::Param>.m_index =
         (uint32_t)params.first.super_row_base<winmd::reader::Param>.m_table;
    winmd::reader::row_base<winmd::reader::Param>::operator++
              ((row_base<winmd::reader::Param> *)local_38);
  }
  local_48 = 0;
  while( true ) {
    uVar5 = (ulong)local_48;
    local_58 = winmd::reader::MethodDefSig::Params(&this->m_signature);
    sVar6 = winmd::reader::
            size<__gnu_cxx::__normal_iterator<winmd::reader::ParamSig_const*,std::vector<winmd::reader::ParamSig,std::allocator<winmd::reader::ParamSig>>>>
                      (&local_58);
    if (uVar5 == sVar6) break;
    vVar7 = winmd::reader::row_base<winmd::reader::Param>::operator+
                      ((row_base<winmd::reader::Param> *)local_38,local_48);
    local_78 = vVar7.super_row_base<winmd::reader::Param>.m_table;
    local_70 = vVar7.super_row_base<winmd::reader::Param>.m_index;
    local_68.super_row_base<winmd::reader::Param>.m_table = local_78;
    local_68.super_row_base<winmd::reader::Param>.m_index = local_70;
    local_90 = winmd::reader::MethodDefSig::Params(&this->m_signature);
    local_80 = __gnu_cxx::
               __normal_iterator<const_winmd::reader::ParamSig_*,_std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>_>
               ::operator[](&local_90.first,(ulong)local_48);
    ::std::
    vector<std::pair<winmd::reader::Param,winmd::reader::ParamSig_const*>,std::allocator<std::pair<winmd::reader::Param,winmd::reader::ParamSig_const*>>>
    ::emplace_back<winmd::reader::Param,winmd::reader::ParamSig_const*>
              ((vector<std::pair<winmd::reader::Param,winmd::reader::ParamSig_const*>,std::allocator<std::pair<winmd::reader::Param,winmd::reader::ParamSig_const*>>>
                *)&this->m_params,&local_68,&local_80);
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

explicit method_signature(MethodDef const& method) :
            m_method(method),
            m_signature(method.Signature())
        {
            auto params = method.ParamList();

            if (m_signature.ReturnType() && params.first != params.second && params.first.Sequence() == 0)
            {
                m_return = params.first;
                ++params.first;
            }

            for (uint32_t i{}; i != size(m_signature.Params()); ++i)
            {
                m_params.emplace_back(params.first + i, &m_signature.Params().first[i]);
            }
        }